

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

bool util::PrintRecords(SelectStatement *stmt,
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                       *cols,table *t,int *selectvalue)

{
  ExprType EVar1;
  pointer pcVar2;
  pointer ppVar3;
  long lVar4;
  pointer ppcVar5;
  column *pcVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  Expr *pEVar11;
  ostream *poVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  char *pcVar14;
  char *str2;
  int *piVar15;
  size_t sVar16;
  ExprType EVar17;
  uint uVar18;
  column *pcVar19;
  long lVar20;
  pointer ppVar21;
  column *col;
  int iVar22;
  column *col_1;
  pointer ppcVar23;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*> it
  ;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  *__range2;
  vector<int,_std::allocator<int>_> printedrecords;
  ifstream os;
  int local_2b4;
  pointer local_2b0;
  char *local_2a8;
  size_t local_2a0;
  char local_298 [16];
  column *local_288;
  SelectStatement *local_280;
  table *local_278;
  int local_26c;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  *local_268;
  uint local_25c;
  void *local_258;
  iterator iStack_250;
  int *local_248;
  int *local_240;
  char local_238 [520];
  
  pcVar2 = (t->filename)._M_dataplus._M_p;
  local_2a8 = local_298;
  local_280 = stmt;
  local_278 = t;
  local_268 = cols;
  local_240 = selectvalue;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a8,pcVar2,pcVar2 + (t->filename)._M_string_length);
  std::ifstream::ifstream(local_238,(string *)&local_2a8,_S_in|_S_bin);
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Can\'t open table ",0x11);
    pcVar14 = local_280->fromTable->name;
    if (pcVar14 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12d270);
    }
    else {
      sVar16 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,sVar16);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  else {
    ppVar21 = (local_268->
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (local_268->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar21 != ppVar3) {
      do {
        local_2a8 = local_298;
        pcVar2 = (ppVar21->first)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a8,pcVar2,pcVar2 + (ppVar21->first)._M_string_length);
        pcVar19 = ppVar21->second;
        local_288 = pcVar19;
        if (pcVar19 == (column *)0x0) {
LAB_0011c4f5:
          lVar20 = std::cout;
          *(uint *)(malloc + *(long *)(std::cout + -0x18)) =
               *(uint *)(malloc + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
          *(undefined8 *)(std::ostream::write + *(long *)(lVar20 + -0x18)) = 8;
          lVar4 = *(long *)(lVar20 + -0x18);
          lVar20 = (long)&std::cout + lVar4;
          if ((&DAT_0012d351)[lVar4] == '\0') {
            std::ios::widen((char)lVar20);
LAB_0011c53a:
            *(undefined1 *)(lVar20 + 0xe1) = 1;
          }
LAB_0011c543:
          *(undefined1 *)(lVar20 + 0xe0) = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,local_2a8,local_2a0);
        }
        else {
          iVar9 = std::__cxx11::string::compare((char *)&pcVar19->flag);
          if (iVar9 == 0) goto LAB_0011c4f5;
          iVar9 = std::__cxx11::string::compare((char *)&pcVar19->flag);
          lVar20 = std::cout;
          if (iVar9 == 0) {
            *(uint *)(malloc + *(long *)(std::cout + -0x18)) =
                 *(uint *)(malloc + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
            iVar9 = pcVar19->element_size + 2;
            if (pcVar19->element_size < 7) {
              iVar9 = 8;
            }
            *(long *)(std::ostream::write + *(long *)(lVar20 + -0x18)) = (long)iVar9;
            lVar4 = *(long *)(lVar20 + -0x18);
            lVar20 = (long)&std::cout + lVar4;
            if ((&DAT_0012d351)[lVar4] == '\0') {
              std::ios::widen((char)lVar20);
              goto LAB_0011c53a;
            }
            goto LAB_0011c543;
          }
        }
        if (local_2a8 != local_298) {
          operator_delete(local_2a8);
        }
        ppVar21 = ppVar21 + 1;
      } while (ppVar21 != ppVar3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      local_258 = (void *)0x0;
      iStack_250._M_current = (int *)0x0;
      local_248 = (int *)0x0;
      local_2b4 = 0;
      if (0 < local_278->rowlength) {
        do {
          pEVar11 = local_280->whereClause;
          if (pEVar11 == (Expr *)0x0) goto LAB_0011cbd3;
          if (((pEVar11->type != kExprOperator) || (pEVar11->opType != SIMPLE_OP)) ||
             (2 < (byte)(pEVar11->opChar - 0x3cU))) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Invalide where clause",0x15);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
            std::ostream::put('p');
            std::ostream::flush();
LAB_0011d0ff:
            bVar8 = false;
            goto LAB_0011d101;
          }
          if ((pEVar11->expr2->type == kExprLiteralInt) ||
             (EVar17 = pEVar11->expr->type, EVar17 == kExprLiteralInt)) {
            local_2a8 = local_298;
            local_2a0 = 0;
            local_298[0] = '\0';
            EVar17 = pEVar11->expr2->type;
            if (EVar17 == kExprLiteralString) {
LAB_0011c652:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"cannot do compare between int and char",0x26);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
              std::ostream::put('p');
              std::ostream::flush();
              iVar9 = 1;
              goto LAB_0011c931;
            }
            if (EVar17 == kExprLiteralInt) {
              if (pEVar11->expr->type == kExprLiteralString) goto LAB_0011c652;
              pcVar14 = pEVar11->expr->name;
              strlen(pcVar14);
              lVar20 = 0x10;
              std::__cxx11::string::_M_replace((ulong)&local_2a8,0,(char *)0x0,(ulong)pcVar14);
            }
            else {
              pcVar14 = pEVar11->expr2->name;
              strlen(pcVar14);
              lVar20 = 8;
              std::__cxx11::string::_M_replace((ulong)&local_2a8,0,(char *)0x0,(ulong)pcVar14);
            }
            sVar16 = local_2a0;
            pcVar14 = local_2a8;
            ppcVar23 = (local_278->table_cols).
                       super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            ppcVar5 = (local_278->table_cols).
                      super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (ppcVar23 == ppcVar5) {
LAB_0011c87f:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"column ",7);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_2a8,local_2a0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12," do not exist in table",0x16);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
              std::ostream::put((char)poVar12);
              std::ostream::flush();
              iVar9 = 1;
            }
            else {
              local_2b0 = (pointer)CONCAT44(local_2b0._4_4_,
                                            *(undefined4 *)
                                             (*(long *)((long)&local_280->whereClause->type + lVar20
                                                       ) + 0x48));
              pcVar19 = (column *)0x0;
              do {
                pcVar6 = *ppcVar23;
                if ((sVar16 == (pcVar6->name)._M_string_length) &&
                   ((sVar16 == 0 ||
                    (iVar9 = bcmp(pcVar14,(pcVar6->name)._M_dataplus._M_p,sVar16), iVar9 == 0)))) {
                  pcVar19 = pcVar6;
                }
                ppcVar23 = ppcVar23 + 1;
              } while (ppcVar23 != ppcVar5);
              if (pcVar19 == (column *)0x0) goto LAB_0011c87f;
              std::istream::seekg(local_238,
                                  (long)pcVar19->col_offset +
                                  (long)local_278->rowSize * (long)local_2b4,0);
              iVar9 = pcVar19->element_truesize;
              if (iVar9 < 0) {
                iVar9 = -1;
              }
              piVar15 = (int *)operator_new__((long)iVar9);
              std::istream::read(local_238,(long)piVar15);
              cVar7 = local_280->whereClause->opChar;
              if (cVar7 == '=') {
                iVar9 = std::__cxx11::string::compare((char *)&pcVar19->flag);
                pcVar14 = "cannot do = for char columns with int value";
                if (iVar9 == 0) {
LAB_0011c8eb:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pcVar14,0x2b);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                  std::ostream::put('p');
                  iVar22 = 1;
                  std::ostream::flush();
                }
                else {
                  iVar22 = 6;
                  if (*piVar15 == (int)local_2b0) {
                    cVar7 = local_280->whereClause->opChar;
                    goto LAB_0011c7fb;
                  }
                }
LAB_0011c926:
                operator_delete(piVar15);
                iVar9 = iVar22;
              }
              else {
LAB_0011c7fb:
                if (cVar7 == '>') {
                  iVar9 = std::__cxx11::string::compare((char *)&pcVar19->flag);
                  pcVar14 = "cannot do > for char columns with int value";
                  if (iVar9 == 0) goto LAB_0011c8eb;
                  iVar22 = 6;
                  if (*piVar15 <= (int)local_2b0) goto LAB_0011c926;
                  cVar7 = local_280->whereClause->opChar;
                }
                iVar9 = 0;
                if (cVar7 == '<') {
                  iVar9 = std::__cxx11::string::compare((char *)&pcVar19->flag);
                  pcVar14 = "cannot do < for char columns with int value";
                  if (iVar9 == 0) goto LAB_0011c8eb;
                  iVar22 = 6;
                  iVar9 = 0;
                  if ((int)local_2b0 <= *piVar15) goto LAB_0011c926;
                }
              }
            }
LAB_0011c931:
            if (local_2a8 != local_298) {
              operator_delete(local_2a8);
            }
            if (iVar9 != 6) {
              if (iVar9 != 0) goto LAB_0011d0ff;
              pEVar11 = local_280->whereClause;
              EVar17 = pEVar11->expr->type;
              goto LAB_0011c965;
            }
          }
          else {
LAB_0011c965:
            EVar1 = pEVar11->expr2->type;
            if (EVar17 == kExprColumnRef) {
              if (EVar1 != kExprLiteralString) {
                if (EVar1 != kExprColumnRef) goto LAB_0011cbd3;
                goto LAB_0011cffe;
              }
LAB_0011c991:
              local_2a8 = local_298;
              local_2a0 = 0;
              local_298[0] = '\0';
              if (pEVar11->expr2->type == kExprLiteralString) {
                pcVar14 = pEVar11->expr->name;
                strlen(pcVar14);
                lVar20 = 0x10;
                std::__cxx11::string::_M_replace((ulong)&local_2a8,0,(char *)0x0,(ulong)pcVar14);
              }
              else {
                pcVar14 = pEVar11->expr2->name;
                strlen(pcVar14);
                lVar20 = 8;
                std::__cxx11::string::_M_replace((ulong)&local_2a8,0,(char *)0x0,(ulong)pcVar14);
              }
              sVar16 = local_2a0;
              pcVar14 = local_2a8;
              ppcVar23 = (local_278->table_cols).
                         super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
              ppcVar5 = (local_278->table_cols).
                        super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (ppcVar23 == ppcVar5) {
LAB_0011cb0e:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"column ",7);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_2a8,local_2a0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12," do not exist in table",0x16);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
                std::ostream::put((char)poVar12);
                iVar9 = 1;
                std::ostream::flush();
              }
              else {
                local_2b0 = *(pointer *)
                             (*(long *)((long)&local_280->whereClause->type + lVar20) + 0x28);
                pcVar19 = (column *)0x0;
                do {
                  pcVar6 = *ppcVar23;
                  if ((sVar16 == (pcVar6->name)._M_string_length) &&
                     ((sVar16 == 0 ||
                      (iVar9 = bcmp(pcVar14,(pcVar6->name)._M_dataplus._M_p,sVar16), iVar9 == 0))))
                  {
                    pcVar19 = pcVar6;
                  }
                  ppcVar23 = ppcVar23 + 1;
                } while (ppcVar23 != ppcVar5);
                if (pcVar19 == (column *)0x0) goto LAB_0011cb0e;
                std::istream::seekg(local_238,
                                    (long)pcVar19->col_offset +
                                    (long)local_278->rowSize * (long)local_2b4,0);
                iVar9 = pcVar19->element_truesize;
                if (iVar9 < 0) {
                  iVar9 = -1;
                }
                pcVar14 = (char *)operator_new__((long)iVar9);
                std::istream::read(local_238,(long)pcVar14);
                cVar7 = local_280->whereClause->opChar;
                iVar9 = 0;
                if (cVar7 == '<') {
                  iVar22 = compareChar(pcVar14,(char *)local_2b0);
                  iVar9 = 0;
                  if (iVar22 != -1) goto LAB_0011cba0;
                }
                else if (cVar7 == '>') {
                  iVar22 = compareChar(pcVar14,(char *)local_2b0);
                  if (iVar22 != 1) goto LAB_0011cba0;
                }
                else if ((cVar7 == '=') &&
                        (bVar8 = compareString(pcVar14,(char *)local_2b0), !bVar8)) {
LAB_0011cba0:
                  operator_delete(pcVar14);
                  iVar9 = 6;
                }
              }
              if (local_2a8 != local_298) {
                operator_delete(local_2a8);
              }
              if (iVar9 != 0) {
                if (iVar9 != 6) goto LAB_0011d0ff;
                goto LAB_0011cffe;
              }
            }
            else if ((EVar17 == kExprLiteralString) || (EVar1 == kExprLiteralString))
            goto LAB_0011c991;
LAB_0011cbd3:
            local_26c = 0;
            if (0 < local_2b4) {
              uVar18 = 0;
              do {
                _Var13 = std::
                         __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                   (local_258,iStack_250._M_current,&local_26c);
                if (_Var13._M_current != iStack_250._M_current) {
                  ppVar21 = (local_268->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  local_2b0 = (local_268->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish;
                  local_25c = uVar18;
                  if (ppVar21 == local_2b0) {
                    iVar9 = 0;
                    iVar22 = 0;
                  }
                  else {
                    iVar22 = 0;
                    iVar9 = 0;
                    do {
                      local_2a8 = local_298;
                      pcVar2 = (ppVar21->first)._M_dataplus._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_2a8,pcVar2,
                                 pcVar2 + (ppVar21->first)._M_string_length);
                      pcVar19 = ppVar21->second;
                      local_288 = pcVar19;
                      if (pcVar19 != (column *)0x0) {
                        std::istream::seekg(local_238,
                                            (long)pcVar19->col_offset +
                                            (long)local_278->rowSize * (long)local_26c,0);
                        iVar10 = pcVar19->element_truesize;
                        if (iVar10 < 0) {
                          iVar10 = -1;
                        }
                        pcVar14 = (char *)operator_new__((long)iVar10);
                        std::istream::read(local_238,(long)pcVar14);
                        std::istream::seekg(local_238,
                                            (long)pcVar19->col_offset +
                                            (long)local_278->rowSize * (long)local_2b4,0);
                        iVar10 = pcVar19->element_truesize;
                        if (iVar10 < 0) {
                          iVar10 = -1;
                        }
                        str2 = (char *)operator_new__((long)iVar10);
                        std::istream::read(local_238,(long)str2);
                        bVar8 = compareString(pcVar14,str2);
                        iVar22 = iVar22 + (uint)bVar8;
                        iVar9 = iVar9 + 1;
                        operator_delete(pcVar14);
                        operator_delete(str2);
                      }
                      if (local_2a8 != local_298) {
                        operator_delete(local_2a8);
                      }
                      ppVar21 = ppVar21 + 1;
                    } while (ppVar21 != local_2b0);
                  }
                  uVar18 = CONCAT31((int3)(local_25c >> 8),(byte)local_25c | iVar22 == iVar9);
                }
                local_26c = local_26c + 1;
              } while (local_26c < local_2b4);
              if ((uVar18 & 1) != 0) goto LAB_0011cffe;
            }
            ppVar21 = (local_268->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_2b0 = (local_268->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            if (ppVar21 != local_2b0) {
              do {
                local_2a8 = local_298;
                pcVar2 = (ppVar21->first)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2a8,pcVar2,pcVar2 + (ppVar21->first)._M_string_length);
                pcVar19 = ppVar21->second;
                local_288 = pcVar19;
                if (iStack_250._M_current == local_248) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_258,iStack_250,&local_2b4);
                }
                else {
                  *iStack_250._M_current = local_2b4;
                  iStack_250._M_current = iStack_250._M_current + 1;
                }
                lVar20 = std::cout;
                if (pcVar19 == (column *)0x0) {
                  *(uint *)(malloc + *(long *)(std::cout + -0x18)) =
                       *(uint *)(malloc + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
                  *(undefined8 *)(std::ostream::write + *(long *)(lVar20 + -0x18)) = 8;
                  lVar20 = *(long *)(lVar20 + -0x18);
                  if ((&DAT_0012d351)[lVar20] == '\0') {
                    std::ios::widen((char)lVar20 + 'p');
                    (&DAT_0012d351)[lVar20] = 1;
                  }
                  std::ios::clear[lVar20] = (code)0x20;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_2a8,local_2a0);
                }
                else {
                  std::istream::seekg(local_238,
                                      (long)pcVar19->col_offset +
                                      (long)local_278->rowSize * (long)local_2b4,0);
                  iVar9 = pcVar19->element_truesize;
                  if (iVar9 < 0) {
                    iVar9 = -1;
                  }
                  piVar15 = (int *)operator_new__((long)iVar9);
                  std::istream::read(local_238,(long)piVar15);
                  iVar9 = std::__cxx11::string::compare((char *)&pcVar19->flag);
                  lVar20 = std::cout;
                  *(uint *)(malloc + *(long *)(std::cout + -0x18)) =
                       *(uint *)(malloc + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
                  if (iVar9 == 0) {
                    *(undefined8 *)(std::ostream::write + *(long *)(lVar20 + -0x18)) = 8;
                    lVar20 = *(long *)(lVar20 + -0x18);
                    if ((&DAT_0012d351)[lVar20] == '\0') {
                      std::ios::widen((char)lVar20 + 'p');
                      (&DAT_0012d351)[lVar20] = 1;
                    }
                    std::ios::clear[lVar20] = (code)0x20;
                    std::ostream::operator<<((ostream *)&std::cout,*piVar15);
                    *local_240 = *piVar15;
                  }
                  else {
                    iVar9 = pcVar19->element_size + 2;
                    if (pcVar19->element_size < 7) {
                      iVar9 = 8;
                    }
                    *(long *)(std::ostream::write + *(long *)(lVar20 + -0x18)) = (long)iVar9;
                    lVar20 = *(long *)(lVar20 + -0x18);
                    if ((&DAT_0012d351)[lVar20] == '\0') {
                      std::ios::widen((char)lVar20 + 'p');
                      (&DAT_0012d351)[lVar20] = 1;
                    }
                    std::ios::clear[lVar20] = (code)0x20;
                    sVar16 = strlen((char *)piVar15);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)piVar15,sVar16);
                  }
                  operator_delete(piVar15);
                }
                if (local_2a8 != local_298) {
                  operator_delete(local_2a8);
                }
                ppVar21 = ppVar21 + 1;
              } while (ppVar21 != local_2b0);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
            std::ostream::put('p');
            std::ostream::flush();
          }
LAB_0011cffe:
          local_2b4 = local_2b4 + 1;
        } while (local_2b4 < local_278->rowlength);
      }
      bVar8 = true;
      std::ifstream::close();
LAB_0011d101:
      if (local_258 != (void *)0x0) {
        operator_delete(local_258);
      }
      goto LAB_0011d110;
    }
  }
  bVar8 = false;
LAB_0011d110:
  std::ifstream::~ifstream(local_238);
  return bVar8;
}

Assistant:

bool util::PrintRecords(hsql::SelectStatement *stmt, vector<pair<string, column*>> cols, table* t, int &selectvalue){
    ifstream os(t->getName(), ios::in|ios::binary);

    if(!os.is_open()){
        cout <<"Can't open table "<< stmt->fromTable->name  <<endl;
        return false;
    }
    if(cols.empty()){
        return false;
    }
    // header
    for(auto it : cols){
        column* col = it.second;
        if(col == NULL || col->flag == "INT")
            cout <<left<<setw(8)<<setfill(' ')<<it.first;
        else if(col->flag == "CHAR")
            cout <<left<<setw(col->element_size +2 > 8 ? col->element_size+2 : 8)<<setfill(' ')<<it.first;
    }
    cout << endl;

    vector<int> printedrecords;
    //print records
    for(int i = 0; i < t->getRowlength(); i++){

        //where condition
        if(stmt->whereClause != NULL){
            if(stmt->whereClause->type != hsql::kExprOperator ||
               stmt->whereClause->opType != hsql::Expr::SIMPLE_OP||
               (stmt->whereClause->opChar != '=' && stmt->whereClause->opChar != '>'&&
                stmt->whereClause->opChar != '<')){
                cout <<"Invalide where clause"<<endl;
                return false;
            }
            //deal with int
            if(stmt->whereClause->expr2->type == hsql::kExprLiteralInt||stmt->whereClause->expr->type == hsql::kExprLiteralInt){
                //select column
                string colName;
                int compareNum;
                if(stmt->whereClause->expr2->type == hsql::kExprLiteralInt) {
                    if(stmt->whereClause->expr->type == hsql::kExprLiteralString){
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->whereClause->expr->name;
                    compareNum = (int) stmt->whereClause->expr2->ival;
                }
                else {
                    if(stmt->whereClause->expr2->type == hsql::kExprLiteralString){
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->whereClause->expr2->name;
                    compareNum = (int) stmt->whereClause->expr->ival;
                }
                column* tempcol = NULL;
                //check if table have this column
                for (auto col: t->table_cols){
                    if(colName == col->name){
                        tempcol = col;
                    }
                }
                if(tempcol == NULL){
                    cout << "column "<< colName << " do not exist in table" <<endl;
                    return false;
                }
                //get column value
                os.seekg(i * t->getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if(stmt->whereClause->opChar == '=') {
                    if(tempcol->flag == "CHAR"){
                        cout << "cannot do = for char columns with int value" <<endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes != compareNum) {
                        delete bytes;
                        continue;
                    }
                }
                //check >
                if(stmt->whereClause->opChar == '>'){
                    if(tempcol->flag == "CHAR"){
                        cout << "cannot do > for char columns with int value" <<endl;
                        delete bytes;
                        return false;
                    }
                    if(*(int *)bytes <= compareNum){
                        delete bytes;
                        continue;
                    }
                }
                //check <
                if(stmt->whereClause->opChar == '<'){
                    if(tempcol->flag == "CHAR"){
                        cout << "cannot do < for char columns with int value" <<endl;
                        delete bytes;
                        return false;
                    }
                    if(*(int *)bytes >= compareNum){
                        delete bytes;
                        continue;
                    }
                }

            }
            if(stmt->whereClause->expr->type == hsql::kExprColumnRef&&stmt->whereClause->expr2->type == hsql::kExprColumnRef)
                continue;
            //do char
            if(stmt->whereClause->expr2->type == hsql::kExprLiteralString||stmt->whereClause->expr->type == hsql::kExprLiteralString){
                //select column
                string colName;
                char* compareChar;
                if(stmt->whereClause->expr2->type == hsql::kExprLiteralString) {
                    colName = stmt->whereClause->expr->name;
                    compareChar = stmt->whereClause->expr2->name;
                }
                else {
                    colName = stmt->whereClause->expr2->name;
                    compareChar = stmt->whereClause->expr->name;
                }
                column* tempcol = NULL;
                //check if table have this column
                for (auto col: t->table_cols){
                    if(colName == col->name){
                        tempcol = col;
                    }
                }
                if(tempcol == NULL){
                    cout << "column "<< colName << " do not exist in table" <<endl;
                    return false;
                }
                //get column value
                os.seekg(i * t->getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if(stmt->whereClause->opChar == '=') {
                    if (!util::compareString(bytes ,compareChar)) {
                        delete bytes;
                        continue;
                    }
                }
                    //check >
                else if(stmt->whereClause->opChar == '>'){
                    if(util::compareChar(bytes, compareChar) != 1){
                        delete bytes;
                        continue;
                    }
                }
                    //check <
                else if(stmt->whereClause->opChar == '<'){
                    if(util::compareChar(bytes, compareChar) != -1){
                        delete bytes;
                        continue;
                    }
                }

            }

        }
        //check duplicates
        bool duplicates = false;
        for(int j = 0; j<i; j++){
            if(find(printedrecords.begin(), printedrecords.end(), j)== printedrecords.end())
                continue;
            int count_duplicates = 0;
            int countcol = 0;
            for(auto it:cols){
                column* col = it.second;
                if (col!=NULL){
                    os.seekg(j * t->getrowSize() + col->col_offset);
                    char* prebytes = new char[col->element_truesize];
                    os.read(prebytes, col->element_truesize);

                    os.seekg(i * t->getrowSize() + col->col_offset);
                    char* curbytes = new char[col->element_truesize];
                    os.read(curbytes, col->element_truesize);
                    if(util::compareString(prebytes, curbytes))
                        count_duplicates += 1;
                    countcol += 1;
                    delete prebytes;
                    delete curbytes;
                }

            }
            if(count_duplicates == countcol)
                duplicates = true;
        }
        if(duplicates)
            continue;
        //do print

        for(auto it:cols) {
            column *col = it.second;
            printedrecords.push_back(i);

            if (col != NULL) {

                os.seekg(i * t->getrowSize() + col->col_offset);
                char *bytes = new char[col->element_truesize];
                //cout << "bytes: " << bytes << " -- true size: " << col->element_truesize << endl;
                os.read(bytes, col->element_truesize);


                if ( col->flag == "INT"){
                    cout << left << setw(8) << setfill(' ') << *(int *) bytes;
                    selectvalue = *(int *) bytes;

                }

                else {
                    cout << left << setw(col->element_size + 2 > 8 ? col->element_size + 2 : 8)
                         << setfill(' ') << bytes;
                }

                delete bytes;

            } else {
                cout << left << setw(8) << setfill(' ') << it.first;
            }
        }
        cout << endl;
    }
    os.close();
    return true;
}